

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

void If_CluSemiCanonicizeVerify
               (word *pTruth,word *pTruth0,int nVars,int *pCanonPerm,uint uCanonPhase)

{
  byte bVar1;
  bool bVar2;
  word *pwVar3;
  int iVar4;
  int Counter;
  int fChange;
  int Temp;
  int i;
  word *pTemp;
  word *pOut;
  word *pIn;
  word pGunc [1024];
  word pFunc [1024];
  uint uCanonPhase_local;
  int *pCanonPerm_local;
  int nVars_local;
  word *pTruth0_local;
  word *pTruth_local;
  
  pTemp = pGunc + 0x3ff;
  bVar1 = 0;
  If_CluCopy((word *)&pIn,pTruth,nVars);
  pOut = pTruth;
  do {
    bVar2 = false;
    for (fChange = 0; pwVar3 = pOut, fChange < nVars + -1; fChange = fChange + 1) {
      if (pCanonPerm[fChange + 1] <= pCanonPerm[fChange]) {
        bVar1 = bVar1 + 1;
        bVar2 = true;
        iVar4 = pCanonPerm[fChange];
        pCanonPerm[fChange] = pCanonPerm[fChange + 1];
        pCanonPerm[fChange + 1] = iVar4;
        If_CluSwapAdjacent(pTemp,pOut,fChange,nVars);
        pOut = pTemp;
        pTemp = pwVar3;
      }
    }
  } while (bVar2);
  if ((bool)(bVar1 & 1)) {
    If_CluCopy(pTemp,pOut,nVars);
  }
  for (fChange = 0; fChange < nVars; fChange = fChange + 1) {
    if ((uCanonPhase >> ((byte)fChange & 0x1f) & 1) != 0) {
      If_CluChangePhase(pTruth,nVars,fChange);
    }
  }
  iVar4 = If_CluEqual(pTruth0,pTruth,nVars);
  if (iVar4 == 0) {
    Kit_DsdPrintFromTruth((uint *)pTruth0,nVars);
    printf("\n");
    Kit_DsdPrintFromTruth((uint *)&pIn,nVars);
    printf("\n");
    Kit_DsdPrintFromTruth((uint *)pTruth,nVars);
    printf("\n");
    printf("SemiCanonical verification FAILED!\n");
  }
  return;
}

Assistant:

void If_CluSemiCanonicizeVerify( word * pTruth, word * pTruth0, int nVars, int * pCanonPerm, unsigned uCanonPhase )
{
    word pFunc[CLU_WRD_MAX], pGunc[CLU_WRD_MAX], * pIn = pTruth, * pOut = pFunc, * pTemp;
    int i, Temp, fChange, Counter = 0;
    If_CluCopy( pGunc, pTruth, nVars );
    // undo permutation
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            if ( pCanonPerm[i] < pCanonPerm[i+1] )
                continue;

            Counter++;
            fChange = 1;

            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;

            If_CluSwapAdjacent( pOut, pIn, i, nVars );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );
    if ( Counter & 1 )
        If_CluCopy( pOut, pIn, nVars );
    // undo phase
    for ( i = 0; i < nVars; i++ )
        if ( (uCanonPhase >> i) & 1 )
            If_CluChangePhase( pTruth, nVars, i );
    // compare
    if ( !If_CluEqual(pTruth0, pTruth, nVars) )
    {
        Kit_DsdPrintFromTruth( (unsigned*)pTruth0, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pGunc, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pTruth, nVars ); printf( "\n" );
        printf( "SemiCanonical verification FAILED!\n" );
    }
}